

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnode_level.c
# Opt level: O1

mpt_node * mpt_gnode_samelevel(mpt_node *start,size_t up)

{
  int *piVar1;
  mpt_node *start_00;
  mpt_node *pmVar2;
  
  if (start == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
LAB_00115e32:
    pmVar2 = (mpt_node *)0x0;
  }
  else if ((up == 0) || (start->next != (mpt_node *)0x0)) {
    pmVar2 = start->next;
  }
  else {
    start_00 = start->parent;
    do {
      start_00 = mpt_gnode_samelevel(start_00,up - 1);
      if (start_00 == (mpt_node *)0x0) goto LAB_00115e32;
      pmVar2 = start_00->children;
    } while (pmVar2 == (mpt_node *)0x0);
  }
  return pmVar2;
}

Assistant:

extern MPT_STRUCT(node) *mpt_gnode_samelevel(MPT_STRUCT(node) *start, size_t up)
{
	if ( !start ) {
		errno = EFAULT; return 0;
	}
	
	if ( !up || start->next )
		return start->next;
	
	start = start->parent;
	
	while ( (start = mpt_gnode_samelevel(start, up-1)) )
		if ( start->children )
			return start->children;
	return 0;
}